

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treemodel.cpp
# Opt level: O0

UByteArray * __thiscall
TreeModel::body(UByteArray *__return_storage_ptr__,TreeModel *this,UModelIndex *index)

{
  bool bVar1;
  TreeItem *this_00;
  TreeItem *item;
  UModelIndex *index_local;
  TreeModel *this_local;
  
  bVar1 = UModelIndex::isValid(index);
  if (bVar1) {
    this_00 = (TreeItem *)UModelIndex::internalPointer(index);
    TreeItem::body(__return_storage_ptr__,this_00);
  }
  else {
    UByteArray::UByteArray(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

UByteArray TreeModel::body(const UModelIndex &index) const
{
    if (!index.isValid())
        return UByteArray();
    TreeItem *item = static_cast<TreeItem*>(index.internalPointer());
    return item->body();
}